

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRTrackerEvent.cpp
# Opt level: O3

float * __thiscall MinVR::VRTrackerEvent::getTransform(VRTrackerEvent *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VRDataIndex *pVVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  VRAnyCoreType VVar6;
  undefined4 extraout_var;
  VRError *this_00;
  long *plVar7;
  size_type *psVar8;
  string local_138;
  int local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar2 = this->_index;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Transform","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  bVar4 = VRDataIndex::exists(pVVar2,&local_138,&local_d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pVVar2 = this->_index;
    local_138._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Transform","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    VVar6 = VRDataIndex::getValue(pVVar2,&local_138,&local_f0,true);
    iVar5 = (*(VVar6.datum)->_vptr_VRDatum[0xe])(VVar6.datum);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    return *(float **)CONCAT44(extraout_var,iVar5);
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  pcVar3 = (this->_index->_indexName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar3,pcVar3 + (this->_index->_indexName)._M_string_length);
  std::operator+(&local_50,
                 "VRTrackerEvent::getTransform() cannot determine a data field to return for event named "
                 ,&local_110);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_138._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
    local_138.field_2._M_allocated_capacity = *psVar8;
    local_138.field_2._8_4_ = (undefined4)plVar7[3];
    local_138.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_138._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar8;
  }
  local_138._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "Tracker_Move events should have an entry in their data index called Transform.","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/api/impl/VRTrackerEvent.cpp"
             ,"");
  local_114 = 0x26;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"const float *MinVR::VRTrackerEvent::getTransform() const","");
  VRError::VRError(this_00,&local_138,&local_70,&local_90,&local_114,&local_b0);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

const float * VRTrackerEvent::getTransform() const {
    if (_index.exists("Transform")) {
        const std::vector<float> *v = _index.getValue("Transform");
        return &(v->front());
    }
    else {
        VRERROR("VRTrackerEvent::getTransform() cannot determine a data field to return for event named " +
                _index.getName() + ".", "Tracker_Move events should have an entry in their data index called Transform.");
        return NULL;
    }
}